

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

void __thiscall aiNode::aiNode(aiNode *this)

{
  long *plVar1;
  size_t __n;
  long *local_40;
  ulong local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  plVar1 = local_40;
  __n = 0x3ff;
  if ((local_38 & 0xfffffc00) == 0) {
    __n = local_38 & 0xffffffff;
  }
  (this->mName).length = (ai_uint32)__n;
  memcpy((this->mName).data,local_40,__n);
  (this->mName).data[__n] = '\0';
  if (plVar1 != local_30) {
    operator_delete(plVar1,local_30[0] + 1);
  }
  (this->mTransformation).a1 = 1.0;
  (this->mTransformation).a2 = 0.0;
  (this->mTransformation).a3 = 0.0;
  (this->mTransformation).a4 = 0.0;
  (this->mTransformation).b1 = 0.0;
  (this->mTransformation).b2 = 1.0;
  (this->mTransformation).b3 = 0.0;
  (this->mTransformation).b4 = 0.0;
  (this->mTransformation).c1 = 0.0;
  (this->mTransformation).c2 = 0.0;
  (this->mTransformation).c3 = 1.0;
  (this->mTransformation).c4 = 0.0;
  (this->mTransformation).d1 = 0.0;
  (this->mTransformation).d2 = 0.0;
  (this->mTransformation).d3 = 0.0;
  (this->mTransformation).d4 = 1.0;
  this->mParent = (aiNode *)0x0;
  this->mNumChildren = 0;
  this->mChildren = (aiNode **)0x0;
  this->mNumMeshes = 0;
  this->mMeshes = (uint *)0x0;
  this->mMetaData = (aiMetadata *)0x0;
  return;
}

Assistant:

aiNode::aiNode()
: mName("")
, mParent(nullptr)
, mNumChildren(0)
, mChildren(nullptr)
, mNumMeshes(0)
, mMeshes(nullptr)
, mMetaData(nullptr) {
    // empty
}